

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::GridRenderCase::iterate(GridRenderCase *this)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  TestLog *this_00;
  MessageBuilder *this_01;
  int local_368;
  int ndx_1;
  AllowedRenderFailureException *ex;
  int local_4c;
  byte local_45;
  int ndx;
  bool allLayersOk;
  allocator<tcu::Surface> local_31;
  undefined1 local_30 [8];
  vector<tcu::Surface,_std::allocator<tcu::Surface>_> renderedLayers;
  GridRenderCase *this_local;
  
  iVar1 = this->m_numLayers;
  renderedLayers.super__Vector_base<tcu::Surface,_std::allocator<tcu::Surface>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<tcu::Surface>::allocator(&local_31);
  std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::vector
            ((vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)local_30,(long)iVar1,&local_31);
  std::allocator<tcu::Surface>::~allocator(&local_31);
  local_45 = 1;
  for (local_4c = 0; local_4c < this->m_numLayers; local_4c = local_4c + 1) {
    pvVar3 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                       ((vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)local_30,
                        (long)local_4c);
    tcu::Surface::setSize(pvVar3,0x100,0x100);
  }
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<
            ((MessageBuilder *)&ex,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&ex,
                       (char (*) [135])
                       "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)."
                      );
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&ex);
  renderTo(this,(vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)local_30);
  for (local_368 = 0; local_368 < this->m_numLayers; local_368 = local_368 + 1) {
    pvVar3 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                       ((vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)local_30,
                        (long)local_368);
    bVar2 = verifyResultLayer(this,local_368,pvVar3);
    local_45 = (local_45 & 1 & bVar2) != 0;
  }
  if ((local_45 & 1) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image verification failed");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::~vector
            ((vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)local_30);
  return STOP;
}

Assistant:

GridRenderCase::IterateResult GridRenderCase::iterate (void)
{
	std::vector<tcu::Surface>	renderedLayers	(m_numLayers);
	bool						allLayersOk		= true;

	for (int ndx = 0; ndx < m_numLayers; ++ndx)
		renderedLayers[ndx].setSize(RENDER_SIZE, RENDER_SIZE);

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)." << tcu::TestLog::EndMessage;

	try
	{
		renderTo(renderedLayers);
	}
	catch (const AllowedRenderFailureException& ex)
	{
		// Got accepted failure
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Could not render, reason: " << ex.what() << "\n"
			<< "Failure is allowed."
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}

	for (int ndx = 0; ndx < m_numLayers; ++ndx)
		allLayersOk &= verifyResultLayer(ndx, renderedLayers[ndx]);

	if (allLayersOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	return STOP;
}